

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

size_t release_unused_segments(mstate m)

{
  int iVar1;
  char *__addr;
  malloc_segment *pmVar2;
  size_t __len;
  malloc_tree_chunk *pmVar3;
  bindex_t bVar4;
  uint uVar5;
  long lVar6;
  tbinptr pmVar7;
  malloc_tree_chunk **ppmVar8;
  int iVar9;
  int *piVar10;
  malloc_tree_chunk *pmVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  tbinptr pmVar15;
  tbinptr pmVar16;
  uint uVar17;
  byte bVar18;
  malloc_tree_chunk **ppmVar19;
  malloc_segment *pmVar20;
  ulong uVar21;
  ulong uVar22;
  malloc_segment *pmVar23;
  malloc_segment *pmVar24;
  size_t local_70;
  
  pmVar20 = (m->seg).next;
  if (pmVar20 == (malloc_segment *)0x0) {
    uVar21 = 0;
    local_70 = 0;
  }
  else {
    local_70 = 0;
    uVar21 = 0;
    pmVar23 = &m->seg;
    do {
      __addr = pmVar20->base;
      pmVar2 = pmVar20->next;
      uVar22 = (ulong)(-(int)__addr - 0x10U & 7);
      uVar13 = *(ulong *)(__addr + uVar22 + 8);
      pmVar24 = pmVar20;
      if ((uVar13 & 2) == 0) {
        __len = pmVar20->size;
        pmVar16 = (tbinptr)(__addr + uVar22);
        uVar22 = uVar13 & 0xfffffffffffffffc;
        if (__addr + (__len - 0x40) <= (char *)((long)pmVar16->child + (uVar22 - 0x20))) {
          if (pmVar16 == (tbinptr)m->dv) {
            m->dv = (mchunkptr)0x0;
            m->dvsize = 0;
          }
          else {
            pmVar15 = pmVar16->bk;
            pmVar3 = pmVar16->child[2];
            if (pmVar15 == pmVar16) {
              if (pmVar16->child[1] == (tbinptr)0x0) {
                if (pmVar16->child[0] == (tbinptr)0x0) {
                  pmVar15 = (tbinptr)0x0;
                  goto LAB_0011faf8;
                }
                pmVar7 = pmVar16->child[0];
                ppmVar8 = pmVar16->child;
              }
              else {
                pmVar7 = pmVar16->child[1];
                ppmVar8 = pmVar16->child + 1;
              }
              do {
                do {
                  ppmVar19 = ppmVar8;
                  pmVar15 = pmVar7;
                  pmVar7 = pmVar15->child[1];
                  ppmVar8 = pmVar15->child + 1;
                } while (pmVar15->child[1] != (malloc_tree_chunk *)0x0);
                pmVar7 = pmVar15->child[0];
                ppmVar8 = pmVar15->child;
              } while (pmVar15->child[0] != (malloc_tree_chunk *)0x0);
              *ppmVar19 = (malloc_tree_chunk *)0x0;
            }
            else {
              pmVar11 = pmVar16->fd;
              pmVar11->bk = pmVar15;
              pmVar15->fd = pmVar11;
            }
LAB_0011faf8:
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              bVar4 = (bindex_t)pmVar16->child[3];
              if (pmVar16 == m->treebins[bVar4]) {
                m->treebins[bVar4] = pmVar15;
                if (pmVar15 != (tbinptr)0x0) goto LAB_0011fb25;
                bVar18 = (byte)bVar4 & 0x1f;
                m->treemap = m->treemap & (-2 << bVar18 | 0xfffffffeU >> 0x20 - bVar18);
              }
              else {
                pmVar3->child[pmVar3->child[0] != pmVar16] = pmVar15;
                if (pmVar15 != (tbinptr)0x0) {
LAB_0011fb25:
                  pmVar15->child[2] = pmVar3;
                  pmVar3 = pmVar16->child[0];
                  if (pmVar3 != (malloc_tree_chunk *)0x0) {
                    pmVar15->child[0] = pmVar3;
                    pmVar3->parent = pmVar15;
                  }
                  pmVar3 = pmVar16->child[1];
                  if (pmVar3 != (malloc_tree_chunk *)0x0) {
                    pmVar15->child[1] = pmVar3;
                    pmVar3->parent = pmVar15;
                  }
                }
              }
            }
          }
          piVar10 = __errno_location();
          iVar1 = *piVar10;
          iVar9 = munmap(__addr,__len);
          *piVar10 = iVar1;
          if (iVar9 == 0) {
            local_70 = local_70 + __len;
            pmVar23->next = pmVar2;
            pmVar24 = pmVar23;
          }
          else {
            uVar17 = (uint)(uVar13 >> 8);
            if (uVar17 == 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = 0x1f;
              if (uVar17 < 0x10000) {
                uVar5 = 0x1f;
                if (uVar17 != 0) {
                  for (; uVar17 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                uVar13 = (ulong)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar5 ^ 0x1f)) & 0x3f) & 1)
                                != 0) | (ulong)((uVar5 ^ 0x1f) * 2 ^ 0x3e);
              }
            }
            pmVar3 = (malloc_tree_chunk *)(m->treebins + uVar13);
            pmVar16->child[3] = (malloc_tree_chunk *)uVar13;
            pmVar16->child[0] = (malloc_tree_chunk *)0x0;
            pmVar16->child[1] = (malloc_tree_chunk *)0x0;
            if ((m->treemap >> ((uint)uVar13 & 0x1f) & 1) == 0) {
              m->treemap = m->treemap | 1 << ((byte)uVar13 & 0x1f);
              pmVar3->prev_foot = (size_t)pmVar16;
              pmVar16->child[2] = pmVar3;
            }
            else {
              bVar18 = 0x39 - (char)(uVar13 >> 1);
              if (uVar13 == 0x1f) {
                bVar18 = 0;
              }
              lVar14 = uVar22 << (bVar18 & 0x3f);
              pmVar3 = (malloc_tree_chunk *)pmVar3->prev_foot;
              do {
                pmVar11 = pmVar3;
                if ((pmVar11->head & 0xfffffffffffffffc) == uVar22) {
                  pmVar3 = pmVar11->fd;
                  pmVar3->bk = pmVar16;
                  pmVar11->fd = pmVar16;
                  pmVar16->fd = pmVar3;
                  pmVar16->bk = pmVar11;
                  pmVar16->child[2] = (malloc_tree_chunk *)0x0;
                  goto LAB_0011fc9e;
                }
                lVar6 = lVar14 >> 0x3f;
                lVar14 = lVar14 * 2;
                pmVar3 = *(malloc_tree_chunk **)((long)pmVar11 + lVar6 * -8 + 0x20);
              } while (pmVar3 != (malloc_tree_chunk *)0x0);
              *(tbinptr *)((long)pmVar11 + lVar6 * -8 + 0x20) = pmVar16;
              pmVar16->child[2] = pmVar11;
            }
            pmVar16->bk = pmVar16;
            pmVar16->fd = pmVar16;
          }
        }
      }
LAB_0011fc9e:
      uVar21 = uVar21 + 1;
      pmVar20 = pmVar2;
      pmVar23 = pmVar24;
    } while (pmVar2 != (malloc_segment *)0x0);
  }
  sVar12 = 0xff;
  if (0xff < uVar21) {
    sVar12 = uVar21;
  }
  m->release_checks = sVar12;
  return local_70;
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}